

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cShaderImageLoadStoreTests.cpp
# Opt level: O0

bool __thiscall
gl4cts::anon_unknown_0::NegativeLinkErrors::Link(NegativeLinkErrors *this,string *vs,string *fs)

{
  GLchar local_458 [8];
  GLchar log [1024];
  int local_4c;
  GLchar *pGStack_48;
  GLint status;
  char *fssrc;
  GLchar *pGStack_38;
  GLuint fsh;
  char *vssrc;
  GLuint vsh;
  GLuint p;
  string *fs_local;
  string *vs_local;
  NegativeLinkErrors *this_local;
  
  _vsh = fs;
  fs_local = vs;
  vs_local = (string *)this;
  vssrc._4_4_ = glu::CallLogWrapper::glCreateProgram
                          (&(this->super_ShaderImageLoadStoreBase).super_SubcaseBase.super_GLWrapper
                            .super_CallLogWrapper);
  vssrc._0_4_ = glu::CallLogWrapper::glCreateShader
                          (&(this->super_ShaderImageLoadStoreBase).super_SubcaseBase.super_GLWrapper
                            .super_CallLogWrapper,0x8b31);
  glu::CallLogWrapper::glAttachShader
            (&(this->super_ShaderImageLoadStoreBase).super_SubcaseBase.super_GLWrapper.
              super_CallLogWrapper,vssrc._4_4_,(GLuint)vssrc);
  glu::CallLogWrapper::glDeleteShader
            (&(this->super_ShaderImageLoadStoreBase).super_SubcaseBase.super_GLWrapper.
              super_CallLogWrapper,(GLuint)vssrc);
  pGStack_38 = (GLchar *)std::__cxx11::string::c_str();
  glu::CallLogWrapper::glShaderSource
            (&(this->super_ShaderImageLoadStoreBase).super_SubcaseBase.super_GLWrapper.
              super_CallLogWrapper,(GLuint)vssrc,1,&stack0xffffffffffffffc8,(GLint *)0x0);
  glu::CallLogWrapper::glCompileShader
            (&(this->super_ShaderImageLoadStoreBase).super_SubcaseBase.super_GLWrapper.
              super_CallLogWrapper,(GLuint)vssrc);
  fssrc._4_4_ = glu::CallLogWrapper::glCreateShader
                          (&(this->super_ShaderImageLoadStoreBase).super_SubcaseBase.super_GLWrapper
                            .super_CallLogWrapper,0x8b30);
  glu::CallLogWrapper::glAttachShader
            (&(this->super_ShaderImageLoadStoreBase).super_SubcaseBase.super_GLWrapper.
              super_CallLogWrapper,vssrc._4_4_,fssrc._4_4_);
  glu::CallLogWrapper::glDeleteShader
            (&(this->super_ShaderImageLoadStoreBase).super_SubcaseBase.super_GLWrapper.
              super_CallLogWrapper,fssrc._4_4_);
  pGStack_48 = (GLchar *)std::__cxx11::string::c_str();
  glu::CallLogWrapper::glShaderSource
            (&(this->super_ShaderImageLoadStoreBase).super_SubcaseBase.super_GLWrapper.
              super_CallLogWrapper,fssrc._4_4_,1,&stack0xffffffffffffffb8,(GLint *)0x0);
  glu::CallLogWrapper::glCompileShader
            (&(this->super_ShaderImageLoadStoreBase).super_SubcaseBase.super_GLWrapper.
              super_CallLogWrapper,fssrc._4_4_);
  glu::CallLogWrapper::glGetShaderiv
            (&(this->super_ShaderImageLoadStoreBase).super_SubcaseBase.super_GLWrapper.
              super_CallLogWrapper,(GLuint)vssrc,0x8b81,&local_4c);
  if (local_4c == 0) {
    glu::CallLogWrapper::glDeleteProgram
              (&(this->super_ShaderImageLoadStoreBase).super_SubcaseBase.super_GLWrapper.
                super_CallLogWrapper,vssrc._4_4_);
    anon_unknown_0::Output("VS compilation should be ok.\n");
    this_local._7_1_ = false;
  }
  else {
    glu::CallLogWrapper::glGetShaderiv
              (&(this->super_ShaderImageLoadStoreBase).super_SubcaseBase.super_GLWrapper.
                super_CallLogWrapper,fssrc._4_4_,0x8b81,&local_4c);
    if (local_4c == 0) {
      glu::CallLogWrapper::glDeleteProgram
                (&(this->super_ShaderImageLoadStoreBase).super_SubcaseBase.super_GLWrapper.
                  super_CallLogWrapper,vssrc._4_4_);
      anon_unknown_0::Output("FS compilation should be ok.\n");
      this_local._7_1_ = false;
    }
    else {
      glu::CallLogWrapper::glLinkProgram
                (&(this->super_ShaderImageLoadStoreBase).super_SubcaseBase.super_GLWrapper.
                  super_CallLogWrapper,vssrc._4_4_);
      glu::CallLogWrapper::glGetProgramInfoLog
                (&(this->super_ShaderImageLoadStoreBase).super_SubcaseBase.super_GLWrapper.
                  super_CallLogWrapper,vssrc._4_4_,0x400,(GLsizei *)0x0,local_458);
      anon_unknown_0::Output("Program Info Log:\n%s\n",local_458);
      glu::CallLogWrapper::glGetProgramiv
                (&(this->super_ShaderImageLoadStoreBase).super_SubcaseBase.super_GLWrapper.
                  super_CallLogWrapper,vssrc._4_4_,0x8b82,&local_4c);
      glu::CallLogWrapper::glDeleteProgram
                (&(this->super_ShaderImageLoadStoreBase).super_SubcaseBase.super_GLWrapper.
                  super_CallLogWrapper,vssrc._4_4_);
      if (local_4c == 1) {
        anon_unknown_0::Output("Link operation should fail.\n");
        this_local._7_1_ = false;
      }
      else {
        this_local._7_1_ = true;
      }
    }
  }
  return this_local._7_1_;
}

Assistant:

bool Link(const std::string& vs, const std::string& fs)
	{
		const GLuint p = glCreateProgram();

		const GLuint vsh = glCreateShader(GL_VERTEX_SHADER);
		glAttachShader(p, vsh);
		glDeleteShader(vsh);
		const char* const vssrc = vs.c_str();
		glShaderSource(vsh, 1, &vssrc, NULL);
		glCompileShader(vsh);

		const GLuint fsh = glCreateShader(GL_FRAGMENT_SHADER);
		glAttachShader(p, fsh);
		glDeleteShader(fsh);
		const char* const fssrc = fs.c_str();
		glShaderSource(fsh, 1, &fssrc, NULL);
		glCompileShader(fsh);

		GLint status;
		glGetShaderiv(vsh, GL_COMPILE_STATUS, &status);
		if (status == GL_FALSE)
		{
			glDeleteProgram(p);
			Output("VS compilation should be ok.\n");
			return false;
		}
		glGetShaderiv(fsh, GL_COMPILE_STATUS, &status);
		if (status == GL_FALSE)
		{
			glDeleteProgram(p);
			Output("FS compilation should be ok.\n");
			return false;
		}

		glLinkProgram(p);

		GLchar log[1024];
		glGetProgramInfoLog(p, sizeof(log), NULL, log);
		Output("Program Info Log:\n%s\n", log);

		glGetProgramiv(p, GL_LINK_STATUS, &status);
		glDeleteProgram(p);

		if (status == GL_TRUE)
		{
			Output("Link operation should fail.\n");
			return false;
		}

		return true;
	}